

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Input.cxx
# Opt level: O0

int __thiscall Fl_Input::kf_copy_cut(Fl_Input *this)

{
  int iVar1;
  EVP_PKEY_CTX *src;
  Fl_Input *this_local;
  
  iVar1 = Fl_Input_::readonly(&this->super_Fl_Input_);
  if (iVar1 == 0) {
    Fl_Input_::copy(&this->super_Fl_Input_,(EVP_PKEY_CTX *)&DAT_00000001,src);
    this_local._4_4_ = Fl_Input_::cut(&this->super_Fl_Input_);
  }
  else {
    fl_beep(0);
    this_local._4_4_ = 1;
  }
  return this_local._4_4_;
}

Assistant:

int Fl_Input::kf_copy_cut() {
  if (readonly()) { fl_beep(); return 1; }
  copy(1);
  return cut();
}